

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS ParseForNumber(ParseParameters *Params)

{
  size_t local_38;
  size_t actualStringLen;
  size_t maxStringLen;
  char *stringStart;
  char *processedString;
  ParseParameters *pPStack_10;
  JL_STATUS jlStatus;
  ParseParameters *Params_local;
  
  stringStart = (char *)0x0;
  maxStringLen = (size_t)(Params->JsonString + Params->StringIndex);
  actualStringLen = Params->JsonStringLength - Params->StringIndex;
  local_38 = 0;
  pPStack_10 = Params;
  processedString._4_4_ =
       ParseOutNumberString
                 ((char *)maxStringLen,actualStringLen,(_Bool)(Params->IsJson5 & 1),&local_38,
                  &stringStart);
  if (processedString._4_4_ == JL_STATUS_SUCCESS) {
    pPStack_10->StringIndex = local_38 + pPStack_10->StringIndex;
    pPStack_10->Stack[pPStack_10->StackIndex].FinishedProcessing = true;
    processedString._4_4_ =
         JlSetObjectNumberString(pPStack_10->Stack[pPStack_10->StackIndex].Object,stringStart);
    WjTestLib_Free(stringStart);
  }
  if (processedString._4_4_ != JL_STATUS_SUCCESS) {
    JlFreeObjectTree(&pPStack_10->Stack[pPStack_10->StackIndex].Object);
  }
  return processedString._4_4_;
}

Assistant:

static
JL_STATUS
    ParseForNumber
    (
        ParseParameters*    Params
    )
{
    JL_STATUS jlStatus;
    char* processedString = NULL;
    char const* stringStart = Params->JsonString + Params->StringIndex;
    size_t maxStringLen = Params->JsonStringLength - Params->StringIndex;
    size_t actualStringLen = 0;

    jlStatus = ParseOutNumberString( stringStart, maxStringLen, Params->IsJson5, &actualStringLen, &processedString );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        Params->StringIndex += actualStringLen;

        // Set number in object (was already setup as a number object)
        Params->Stack[Params->StackIndex].FinishedProcessing = true;
        jlStatus = JlSetObjectNumberString( Params->Stack[Params->StackIndex].Object, processedString );

        JlFree( processedString );
    }

    if( JL_STATUS_SUCCESS != jlStatus )
    {
        (void) JlFreeObjectTree( &Params->Stack[Params->StackIndex].Object );
    }

    return jlStatus;
}